

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::analysis::DecorationManager::RemoveDecorationsFrom
          (DecorationManager *this,uint32_t id,
          function<bool_(const_spvtools::opt::Instruction_&)> *pred)

{
  Op OVar1;
  long lVar2;
  long lVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  IRContext *this_00;
  bool bVar6;
  bool bVar7;
  uint32_t uVar8;
  iterator iVar9;
  iterator iVar10;
  Operand *pOVar11;
  Operand *pOVar12;
  Instruction *this_01;
  undefined8 *puVar13;
  iterator __begin2;
  undefined8 *puVar14;
  long lVar15;
  __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  __first;
  pointer ppIVar16;
  pointer ppIVar17;
  uint index;
  char *__assertion;
  __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  _Var18;
  int iVar19;
  DecorationManager *this_02;
  iterator __begin4;
  long lVar20;
  function<bool_(const_spvtools::opt::Instruction_&)> *pfVar21;
  uint32_t i;
  uint uVar22;
  bool bVar23;
  initializer_list<unsigned_int> init_list;
  Instruction *inst_1;
  function<bool_(const_spvtools::opt::Instruction_&)> *local_130;
  DecorationManager *local_128;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
  local_120;
  uint32_t id_local;
  IRContext *local_110;
  uint32_t local_104;
  uint32_t local_100;
  uint32_t group_id;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> insts_to_kill;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  group_decorations_to_keep;
  Instruction *decoration;
  unordered_set<const_spvtools::opt::Instruction_*,_std::hash<const_spvtools::opt::Instruction_*>,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::allocator<const_spvtools::opt::Instruction_*>_>
  indirect_decorations_to_remove;
  
  local_130 = pred;
  id_local = id;
  iVar9 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&id_local);
  if (iVar9.
      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
      ._M_cur == (__node_type *)0x0) {
    return false;
  }
  local_110 = this->module_->context_;
  insts_to_kill.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  insts_to_kill.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  insts_to_kill.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar2 = *(long *)((long)iVar9.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                          ._M_cur + 0x40);
  lVar3 = *(long *)((long)iVar9.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                          ._M_cur + 0x48);
  puVar4 = *(undefined8 **)
            ((long)iVar9.
                   super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                   ._M_cur + 0x18);
  for (puVar13 = *(undefined8 **)
                  ((long)iVar9.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                         ._M_cur + 0x10); puVar13 != puVar4; puVar13 = puVar13 + 1) {
    indirect_decorations_to_remove._M_h._M_buckets = (__buckets_ptr)*puVar13;
    bVar6 = std::function<bool_(const_spvtools::opt::Instruction_&)>::operator()
                      (local_130,(Instruction *)indirect_decorations_to_remove._M_h._M_buckets);
    if (bVar6) {
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      push_back(&insts_to_kill,(value_type *)&indirect_decorations_to_remove);
    }
  }
  indirect_decorations_to_remove._M_h._M_buckets =
       &indirect_decorations_to_remove._M_h._M_single_bucket;
  indirect_decorations_to_remove._M_h._M_bucket_count = 1;
  indirect_decorations_to_remove._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  indirect_decorations_to_remove._M_h._M_element_count = 0;
  indirect_decorations_to_remove._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  indirect_decorations_to_remove._M_h._M_rehash_policy._M_next_resize = 0;
  indirect_decorations_to_remove._M_h._M_single_bucket = (__node_base_ptr)0x0;
  puVar4 = *(undefined8 **)
            ((long)iVar9.
                   super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                   ._M_cur + 0x30);
  bVar6 = false;
  local_128 = this;
  local_120 = iVar9.
              super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
              ._M_cur;
  for (puVar13 = *(undefined8 **)
                  ((long)iVar9.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                         ._M_cur + 0x28); puVar13 != puVar4; puVar13 = puVar13 + 1) {
    inst_1 = (Instruction *)*puVar13;
    if ((inst_1->opcode_ & ~OpUndef) != OpGroupDecorate) {
      __assertion = 
      "inst->opcode() == spv::Op::OpGroupDecorate || inst->opcode() == spv::Op::OpGroupMemberDecorate"
      ;
      uVar22 = 0x4f;
LAB_004a6747:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/decoration_manager.cpp"
                    ,uVar22,
                    "bool spvtools::opt::analysis::DecorationManager::RemoveDecorationsFrom(uint32_t, std::function<bool (const Instruction &)>)"
                   );
    }
    group_decorations_to_keep.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    group_decorations_to_keep.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    group_decorations_to_keep.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    group_id = Instruction::GetSingleWordInOperand(inst_1,0);
    iVar10 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)this,&group_id);
    if (iVar10.
        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
        ._M_cur == (__node_type *)0x0) {
      __assertion = "group_iter != id_to_decoration_insts_.end() && \"Unknown decoration group\"";
      uVar22 = 0x55;
      goto LAB_004a6747;
    }
    puVar5 = *(undefined8 **)
              ((long)iVar10.
                     super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                     ._M_cur + 0x18);
    for (puVar14 = *(undefined8 **)
                    ((long)iVar10.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                           ._M_cur + 0x10); puVar14 != puVar5; puVar14 = puVar14 + 1) {
      decoration = (Instruction *)*puVar14;
      bVar7 = std::function<bool_(const_spvtools::opt::Instruction_&)>::operator()
                        (local_130,decoration);
      if (!bVar7) {
        std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
        push_back(&group_decorations_to_keep,&decoration);
      }
    }
    if ((*(long *)((long)iVar10.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                         ._M_cur + 0x18) ==
         *(long *)((long)iVar10.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                         ._M_cur + 0x10)) ||
       ((long)group_decorations_to_keep.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)group_decorations_to_keep.
              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
              ._M_impl.super__Vector_impl_data._M_start !=
        *(long *)((long)iVar10.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                        ._M_cur + 0x18) -
        *(long *)((long)iVar10.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                        ._M_cur + 0x10))) {
      OVar1 = inst_1->opcode_;
      iVar19 = (OVar1 != OpGroupDecorate) + 1;
      uVar22 = 1;
      do {
        local_104 = uVar22 + 1;
        while( true ) {
          uVar8 = Instruction::NumInOperands(inst_1);
          if (uVar8 <= uVar22) {
            uVar8 = Instruction::NumInOperands(inst_1);
            this_00 = local_110;
            this = local_128;
            if (uVar8 == 1) {
              std::
              _Hashtable<spvtools::opt::Instruction_const*,spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction_const*>,std::hash<spvtools::opt::Instruction_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::_M_emplace<spvtools::opt::Instruction*&>
                        ((_Hashtable<spvtools::opt::Instruction_const*,spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction_const*>,std::hash<spvtools::opt::Instruction_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)&indirect_decorations_to_remove,&inst_1);
              std::
              vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
              push_back(&insts_to_kill,&inst_1);
              this = local_128;
            }
            else if (bVar6) {
              IRContext::ForgetUses(local_110,inst_1);
              std::
              _Hashtable<spvtools::opt::Instruction_const*,spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction_const*>,std::hash<spvtools::opt::Instruction_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::_M_emplace<spvtools::opt::Instruction*&>
                        ((_Hashtable<spvtools::opt::Instruction_const*,spvtools::opt::Instruction_const*,std::allocator<spvtools::opt::Instruction_const*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction_const*>,std::hash<spvtools::opt::Instruction_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)&indirect_decorations_to_remove,&inst_1);
              IRContext::AnalyzeUses(this_00,inst_1);
            }
            ppIVar17 = group_decorations_to_keep.
                       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            ppIVar16 = group_decorations_to_keep.
                       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            if (group_decorations_to_keep.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                group_decorations_to_keep.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              for (; ppIVar16 != ppIVar17; ppIVar16 = ppIVar16 + 1) {
                this_01 = Instruction::Clone(*ppIVar16,this->module_->context_);
                local_100 = id_local;
                init_list._M_len = 1;
                init_list._M_array = &local_100;
                utils::SmallVector<unsigned_int,_2UL>::SmallVector
                          ((SmallVector<unsigned_int,_2UL> *)&decoration,init_list);
                Instruction::SetInOperand(this_01,0,(SmallVector<unsigned_int,_2UL> *)&decoration);
                utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                          ((SmallVector<unsigned_int,_2UL> *)&decoration);
                utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
                          (&this_01->super_IntrusiveNodeBase<spvtools::opt::Instruction>,
                           &(this->module_->annotations_).
                            super_IntrusiveList<spvtools::opt::Instruction>.sentinel_);
                IRContext::AnalyzeUses
                          (local_110,
                           (this->module_->annotations_).
                           super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                           super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_);
              }
            }
            goto LAB_004a642f;
          }
          uVar8 = Instruction::GetSingleWordInOperand(inst_1,uVar22);
          if (uVar8 != id_local) break;
          uVar8 = Instruction::NumInOperands(inst_1);
          index = uVar8 - iVar19;
          if (uVar22 < index) {
            pOVar11 = Instruction::GetInOperand(inst_1,index);
            pOVar12 = Instruction::GetInOperand(inst_1,uVar22);
            Operand::operator=(pOVar12,pOVar11);
            if (OVar1 != OpGroupDecorate) {
              pOVar11 = Instruction::GetInOperand(inst_1,index + 1);
              pOVar12 = Instruction::GetInOperand(inst_1,local_104);
              Operand::operator=(pOVar12,pOVar11);
LAB_004a6314:
              Instruction::RemoveInOperand(inst_1,index + 1);
            }
          }
          else if (OVar1 != OpGroupDecorate) goto LAB_004a6314;
          Instruction::RemoveInOperand(inst_1,index);
          bVar6 = true;
        }
        uVar22 = uVar22 + iVar19;
      } while( true );
    }
LAB_004a642f:
    std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    ~_Vector_base(&group_decorations_to_keep.
                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 );
  }
  _Var18._M_current =
       *(Instruction ***)
        ((long)&((local_120._M_cur)->
                super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                ).
                super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                ._M_storage._M_storage + 0x20);
  local_130 = *(function<bool_(const_spvtools::opt::Instruction_&)> **)
               ((long)&((local_120._M_cur)->
                       super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                       ).
                       super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                       ._M_storage._M_storage + 0x28);
  group_decorations_to_keep.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)&indirect_decorations_to_remove;
  lVar20 = (long)local_130 - (long)_Var18._M_current;
  decoration = (Instruction *)
               group_decorations_to_keep.
               super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  for (lVar15 = lVar20 >> 5; this_02 = local_128, 0 < lVar15; lVar15 = lVar15 + -1) {
    bVar7 = __gnu_cxx::__ops::
            _Iter_pred<spvtools::opt::analysis::DecorationManager::RemoveDecorationsFrom(unsigned_int,std::function<bool(spvtools::opt::Instruction_const&)>)::$_0>
            ::operator()((_Iter_pred<spvtools::opt::analysis::DecorationManager::RemoveDecorationsFrom(unsigned_int,std::function<bool(spvtools::opt::Instruction_const&)>)::__0>
                          *)&decoration,_Var18);
    this_02 = local_128;
    pfVar21 = local_130;
    __first._M_current = _Var18._M_current;
    if (bVar7) goto LAB_004a6545;
    bVar7 = __gnu_cxx::__ops::
            _Iter_pred<spvtools::opt::analysis::DecorationManager::RemoveDecorationsFrom(unsigned_int,std::function<bool(spvtools::opt::Instruction_const&)>)::$_0>
            ::operator()((_Iter_pred<spvtools::opt::analysis::DecorationManager::RemoveDecorationsFrom(unsigned_int,std::function<bool(spvtools::opt::Instruction_const&)>)::__0>
                          *)&decoration,
                         (__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                          )(_Var18._M_current + 1));
    this_02 = local_128;
    pfVar21 = local_130;
    __first._M_current = _Var18._M_current + 1;
    if (bVar7) goto LAB_004a6545;
    bVar7 = __gnu_cxx::__ops::
            _Iter_pred<spvtools::opt::analysis::DecorationManager::RemoveDecorationsFrom(unsigned_int,std::function<bool(spvtools::opt::Instruction_const&)>)::$_0>
            ::operator()((_Iter_pred<spvtools::opt::analysis::DecorationManager::RemoveDecorationsFrom(unsigned_int,std::function<bool(spvtools::opt::Instruction_const&)>)::__0>
                          *)&decoration,
                         (__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                          )(_Var18._M_current + 2));
    this_02 = local_128;
    pfVar21 = local_130;
    __first._M_current = _Var18._M_current + 2;
    if (bVar7) goto LAB_004a6545;
    bVar7 = __gnu_cxx::__ops::
            _Iter_pred<spvtools::opt::analysis::DecorationManager::RemoveDecorationsFrom(unsigned_int,std::function<bool(spvtools::opt::Instruction_const&)>)::$_0>
            ::operator()((_Iter_pred<spvtools::opt::analysis::DecorationManager::RemoveDecorationsFrom(unsigned_int,std::function<bool(spvtools::opt::Instruction_const&)>)::__0>
                          *)&decoration,
                         (__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                          )(_Var18._M_current + 3));
    this_02 = local_128;
    pfVar21 = local_130;
    __first._M_current = _Var18._M_current + 3;
    if (bVar7) goto LAB_004a6545;
    _Var18._M_current = _Var18._M_current + 4;
    lVar20 = lVar20 + -0x20;
  }
  lVar20 = lVar20 >> 3;
  pfVar21 = local_130;
  if (lVar20 == 1) {
LAB_004a66ef:
    bVar7 = __gnu_cxx::__ops::
            _Iter_pred<spvtools::opt::analysis::DecorationManager::RemoveDecorationsFrom(unsigned_int,std::function<bool(spvtools::opt::Instruction_const&)>)::$_0>
            ::operator()((_Iter_pred<spvtools::opt::analysis::DecorationManager::RemoveDecorationsFrom(unsigned_int,std::function<bool(spvtools::opt::Instruction_const&)>)::__0>
                          *)&decoration,_Var18);
    __first._M_current = _Var18._M_current;
    if (!bVar7) {
      __first._M_current = (Instruction **)pfVar21;
    }
  }
  else if (lVar20 == 2) {
LAB_004a66d0:
    pfVar21 = local_130;
    bVar7 = __gnu_cxx::__ops::
            _Iter_pred<spvtools::opt::analysis::DecorationManager::RemoveDecorationsFrom(unsigned_int,std::function<bool(spvtools::opt::Instruction_const&)>)::$_0>
            ::operator()((_Iter_pred<spvtools::opt::analysis::DecorationManager::RemoveDecorationsFrom(unsigned_int,std::function<bool(spvtools::opt::Instruction_const&)>)::__0>
                          *)&decoration,_Var18);
    __first._M_current = _Var18._M_current;
    if (!bVar7) {
      _Var18._M_current = _Var18._M_current + 1;
      goto LAB_004a66ef;
    }
  }
  else {
    __first._M_current = (Instruction **)local_130;
    if (lVar20 != 3) goto LAB_004a657e;
    bVar7 = __gnu_cxx::__ops::
            _Iter_pred<spvtools::opt::analysis::DecorationManager::RemoveDecorationsFrom(unsigned_int,std::function<bool(spvtools::opt::Instruction_const&)>)::$_0>
            ::operator()((_Iter_pred<spvtools::opt::analysis::DecorationManager::RemoveDecorationsFrom(unsigned_int,std::function<bool(spvtools::opt::Instruction_const&)>)::__0>
                          *)&decoration,_Var18);
    pfVar21 = local_130;
    __first._M_current = _Var18._M_current;
    if (!bVar7) {
      _Var18._M_current = _Var18._M_current + 1;
      goto LAB_004a66d0;
    }
  }
LAB_004a6545:
  if ((function<bool_(const_spvtools::opt::Instruction_&)> *)__first._M_current != pfVar21) {
    _Var18._M_current = __first._M_current;
    while (_Var18._M_current = _Var18._M_current + 1,
          (function<bool_(const_spvtools::opt::Instruction_&)> *)_Var18._M_current != pfVar21) {
      bVar7 = __gnu_cxx::__ops::
              _Iter_pred<spvtools::opt::analysis::DecorationManager::RemoveDecorationsFrom(unsigned_int,std::function<bool(spvtools::opt::Instruction_const&)>)::$_0>
              ::operator()((_Iter_pred<spvtools::opt::analysis::DecorationManager::RemoveDecorationsFrom(unsigned_int,std::function<bool(spvtools::opt::Instruction_const&)>)::__0>
                            *)&group_decorations_to_keep,_Var18);
      if (!bVar7) {
        *__first._M_current = *_Var18._M_current;
        __first._M_current = __first._M_current + 1;
      }
    }
  }
LAB_004a657e:
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::erase
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             ((long)iVar9.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                    ._M_cur + 0x28),(const_iterator)__first._M_current,
             (const_iterator)
             *(Instruction ***)
              ((long)&((local_120._M_cur)->
                      super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                      ).
                      super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                      ._M_storage._M_storage + 0x28));
  ppIVar17 = insts_to_kill.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  bVar7 = insts_to_kill.
          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          insts_to_kill.
          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar16 = insts_to_kill.
                  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppIVar16 != ppIVar17;
      ppIVar16 = ppIVar16 + 1) {
    IRContext::KillInst(local_110,*ppIVar16);
  }
  if (insts_to_kill.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      insts_to_kill.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    insts_to_kill.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         insts_to_kill.
         super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  ppIVar17 = insts_to_kill.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (((lVar2 != lVar3) &&
      (*(long *)((long)&((local_120._M_cur)->
                        super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                        ).
                        super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                        ._M_storage._M_storage + 8) ==
       *(long *)((long)&((local_120._M_cur)->
                        super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                        ).
                        super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                        ._M_storage._M_storage + 0x10))) &&
     (*(long *)((long)&((local_120._M_cur)->
                       super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                       ).
                       super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                       ._M_storage._M_storage + 0x20) ==
      *(long *)((long)&((local_120._M_cur)->
                       super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                       ).
                       super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                       ._M_storage._M_storage + 0x28))) {
    puVar4 = *(undefined8 **)
              ((long)&((local_120._M_cur)->
                      super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                      ).
                      super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                      ._M_storage._M_storage + 0x40);
    for (puVar13 = *(undefined8 **)
                    ((long)&((local_120._M_cur)->
                            super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                            ).
                            super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                            ._M_storage._M_storage + 0x38);
        ppIVar17 = insts_to_kill.
                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish, puVar13 != puVar4;
        puVar13 = puVar13 + 1) {
      decoration = (Instruction *)*puVar13;
      std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
      push_back(&insts_to_kill,&decoration);
    }
  }
  bVar23 = insts_to_kill.
           super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_start != ppIVar17;
  for (ppIVar16 = insts_to_kill.
                  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppIVar16 != ppIVar17;
      ppIVar16 = ppIVar16 + 1) {
    IRContext::KillInst(local_110,*ppIVar16);
  }
  if (((*(long *)((long)local_120._M_cur + 0x10) == *(long *)((long)local_120._M_cur + 0x18)) &&
      (*(long *)((long)local_120._M_cur + 0x28) == *(long *)((long)local_120._M_cur + 0x30))) &&
     (*(long *)((long)local_120._M_cur + 0x40) == *(long *)((long)local_120._M_cur + 0x48))) {
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)this_02,(const_iterator)local_120._M_cur);
  }
  std::
  _Hashtable<const_spvtools::opt::Instruction_*,_const_spvtools::opt::Instruction_*,_std::allocator<const_spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&indirect_decorations_to_remove._M_h);
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&insts_to_kill.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               );
  return (bool)(bVar6 | bVar7 | bVar23);
}

Assistant:

bool DecorationManager::RemoveDecorationsFrom(
    uint32_t id, std::function<bool(const Instruction&)> pred) {
  bool was_modified = false;
  const auto ids_iter = id_to_decoration_insts_.find(id);
  if (ids_iter == id_to_decoration_insts_.end()) {
    return was_modified;
  }

  TargetData& decorations_info = ids_iter->second;
  auto context = module_->context();
  std::vector<Instruction*> insts_to_kill;
  const bool is_group = !decorations_info.decorate_insts.empty();

  // Schedule all direct decorations for removal if instructed as such by
  // |pred|.
  for (Instruction* inst : decorations_info.direct_decorations)
    if (pred(*inst)) insts_to_kill.push_back(inst);

  // For all groups being directly applied to |id|, remove |id| (and the
  // literal if |inst| is an OpGroupMemberDecorate) from the instruction
  // applying the group.
  std::unordered_set<const Instruction*> indirect_decorations_to_remove;
  for (Instruction* inst : decorations_info.indirect_decorations) {
    assert(inst->opcode() == spv::Op::OpGroupDecorate ||
           inst->opcode() == spv::Op::OpGroupMemberDecorate);

    std::vector<Instruction*> group_decorations_to_keep;
    const uint32_t group_id = inst->GetSingleWordInOperand(0u);
    const auto group_iter = id_to_decoration_insts_.find(group_id);
    assert(group_iter != id_to_decoration_insts_.end() &&
           "Unknown decoration group");
    const auto& group_decorations = group_iter->second.direct_decorations;
    for (Instruction* decoration : group_decorations) {
      if (!pred(*decoration)) group_decorations_to_keep.push_back(decoration);
    }

    // If all decorations should be kept, then we can keep |id| part of the
    // group.  However, if the group itself has no decorations, we should remove
    // the id from the group.  This is needed to make |KillNameAndDecorate| work
    // correctly when a decoration group has no decorations.
    if (group_decorations_to_keep.size() == group_decorations.size() &&
        group_decorations.size() != 0) {
      continue;
    }

    // Otherwise, remove |id| from the targets of |group_id|
    const uint32_t stride =
        inst->opcode() == spv::Op::OpGroupDecorate ? 1u : 2u;
    for (uint32_t i = 1u; i < inst->NumInOperands();) {
      if (inst->GetSingleWordInOperand(i) != id) {
        i += stride;
        continue;
      }

      const uint32_t last_operand_index = inst->NumInOperands() - stride;
      if (i < last_operand_index)
        inst->GetInOperand(i) = inst->GetInOperand(last_operand_index);
      // Remove the associated literal, if it exists.
      if (stride == 2u) {
        if (i < last_operand_index)
          inst->GetInOperand(i + 1u) =
              inst->GetInOperand(last_operand_index + 1u);
        inst->RemoveInOperand(last_operand_index + 1u);
      }
      inst->RemoveInOperand(last_operand_index);
      was_modified = true;
    }

    // If the instruction has no targets left, remove the instruction
    // altogether.
    if (inst->NumInOperands() == 1u) {
      indirect_decorations_to_remove.emplace(inst);
      insts_to_kill.push_back(inst);
    } else if (was_modified) {
      context->ForgetUses(inst);
      indirect_decorations_to_remove.emplace(inst);
      context->AnalyzeUses(inst);
    }

    // If only some of the decorations should be kept, clone them and apply
    // them directly to |id|.
    if (!group_decorations_to_keep.empty()) {
      for (Instruction* decoration : group_decorations_to_keep) {
        // simply clone decoration and change |group_id| to |id|
        std::unique_ptr<Instruction> new_inst(
            decoration->Clone(module_->context()));
        new_inst->SetInOperand(0, {id});
        module_->AddAnnotationInst(std::move(new_inst));
        auto decoration_iter = --module_->annotation_end();
        context->AnalyzeUses(&*decoration_iter);
      }
    }
  }

  auto& indirect_decorations = decorations_info.indirect_decorations;
  indirect_decorations.erase(
      std::remove_if(
          indirect_decorations.begin(), indirect_decorations.end(),
          [&indirect_decorations_to_remove](const Instruction* inst) {
            return indirect_decorations_to_remove.count(inst);
          }),
      indirect_decorations.end());

  was_modified |= !insts_to_kill.empty();
  for (Instruction* inst : insts_to_kill) context->KillInst(inst);
  insts_to_kill.clear();

  // Schedule all instructions applying the group for removal if this group no
  // longer applies decorations, either directly or indirectly.
  if (is_group && decorations_info.direct_decorations.empty() &&
      decorations_info.indirect_decorations.empty()) {
    for (Instruction* inst : decorations_info.decorate_insts)
      insts_to_kill.push_back(inst);
  }
  was_modified |= !insts_to_kill.empty();
  for (Instruction* inst : insts_to_kill) context->KillInst(inst);

  if (decorations_info.direct_decorations.empty() &&
      decorations_info.indirect_decorations.empty() &&
      decorations_info.decorate_insts.empty()) {
    id_to_decoration_insts_.erase(ids_iter);
  }
  return was_modified;
}